

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImage.cpp
# Opt level: O1

PreviewImage * __thiscall Imf_3_4::PreviewImage::operator=(PreviewImage *this,PreviewImage *other)

{
  PreviewRgba *pPVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  
  if (this != other) {
    if (this->_pixels != (PreviewRgba *)0x0) {
      operator_delete__(this->_pixels);
    }
    uVar4 = other->_height;
    this->_width = other->_width;
    this->_height = uVar4;
    uVar4 = other->_height * other->_width;
    uVar2 = (ulong)uVar4 * 4;
    pPVar1 = (PreviewRgba *)operator_new__(uVar2);
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        *(undefined4 *)(&pPVar1->r + lVar3) = 0xff000000;
        lVar3 = lVar3 + 4;
      } while (uVar2 - lVar3 != 0);
    }
    this->_pixels = pPVar1;
    if (this->_height * this->_width != 0) {
      uVar2 = 0;
      do {
        this->_pixels[uVar2] = other->_pixels[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->_height * this->_width);
    }
  }
  return this;
}

Assistant:

PreviewImage&
PreviewImage::operator= (const PreviewImage& other)
{
    if (this != &other)
    {
        delete[] _pixels;

        _width  = other._width;
        _height = other._height;
        _pixels = new PreviewRgba[other._width * other._height];

        for (unsigned int i = 0; i < _width * _height; ++i)
            _pixels[i] = other._pixels[i];
    }

    return *this;
}